

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  Curl_easy *pCVar1;
  Curl_easy *pCVar2;
  long lVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  int *piVar11;
  uint *puVar12;
  uint uVar13;
  char *pcVar14;
  ushort uVar15;
  undefined4 uVar16;
  socklen_t __len;
  if2ip_result_t iVar17;
  byte *__s;
  curltime cVar18;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  int optval;
  Curl_sockaddr_storage sa;
  long port;
  char ipaddress [46];
  Curl_sockaddr_ex addr;
  char myhost [256];
  uint local_2c4;
  char *local_2c0;
  undefined4 local_2b8;
  uint local_2b4;
  byte *local_2b0;
  Curl_easy *local_2a8;
  Curl_dns_entry *local_2a0;
  int local_294;
  undefined4 local_290;
  socklen_t local_28c;
  sockaddr local_288;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  long local_200;
  char local_1f8 [48];
  undefined1 local_1c8 [144];
  sockaddr local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  
  pCVar1 = conn->data;
  local_290 = 1;
  *sockp = -1;
  CVar5 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)local_1c8,(curl_socket_t *)&local_2c4);
  if (CVar5 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var4 = Curl_getaddressinfo((sockaddr *)(local_1c8 + 0x10),local_1f8,&local_200);
  if (!_Var4) {
    puVar12 = (uint *)__errno_location();
    uVar13 = *puVar12;
    pcVar14 = Curl_strerror(conn,uVar13);
    Curl_failf(pCVar1,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar13,pcVar14);
    Curl_closesocket(conn,local_2c4);
    return CURLE_OK;
  }
  Curl_infof(pCVar1,"  Trying %s...\n",local_1f8);
  if (((local_1c8._0_4_ & 0xfffffff7) == 2) && (local_1c8._4_4_ == 1)) {
    if ((pCVar1->set).tcp_nodelay == true) {
      Curl_tcpnodelay(conn,local_2c4);
    }
    uVar13 = local_2c4;
    if ((pCVar1->set).tcp_keepalive == true) {
      local_138._0_4_ = 1;
      iVar6 = setsockopt(local_2c4,1,9,&local_138,4);
      if (iVar6 < 0) {
        pcVar14 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar6 = curlx_sltosi((pCVar1->set).tcp_keepidle);
        local_138._0_4_ = iVar6;
        iVar6 = setsockopt(uVar13,6,4,&local_138,4);
        if (iVar6 < 0) {
          Curl_infof(pCVar1,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)uVar13);
        }
        iVar6 = curlx_sltosi((pCVar1->set).tcp_keepintvl);
        local_138._0_4_ = iVar6;
        iVar6 = setsockopt(uVar13,6,5,&local_138,4);
        if (-1 < iVar6) goto LAB_0012762d;
        pcVar14 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(pCVar1,pcVar14,(ulong)uVar13);
    }
  }
LAB_0012762d:
  uVar13 = local_2c4;
  if ((pCVar1->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_0012767f:
    uVar16 = 0;
  }
  else {
    Curl_set_in_callback(pCVar1,true);
    uVar13 = local_2c4;
    iVar6 = (*(pCVar1->set).fsockopt)((pCVar1->set).sockopt_client,local_2c4,CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(pCVar1,false);
    if (iVar6 == 0) goto LAB_0012767f;
    if (iVar6 != 2) {
      Curl_closesocket(conn,uVar13);
      return CURLE_ABORTED_BY_CALLBACK;
    }
    uVar16 = 1;
  }
  if ((local_1c8._0_4_ & 0xfffffff7) != 2) goto LAB_00127b32;
  local_2c0 = (char *)CONCAT44(local_2c0._4_4_,local_1c8._0_4_);
  local_2b8 = uVar16;
  uVar7 = Curl_ipv6_scope((sockaddr *)(local_1c8 + 0x10));
  pCVar2 = conn->data;
  local_2a0 = (Curl_dns_entry *)0x0;
  uVar15 = (pCVar2->set).localport;
  __s = (byte *)(pCVar2->set).str[8];
  uVar16 = local_2b8;
  if (uVar15 == 0 && __s == (byte *)0x0) goto LAB_00127b32;
  local_2b0 = (byte *)CONCAT44(local_2b0._4_4_,uVar7);
  iVar6 = (pCVar2->set).localportrange;
  local_218 = 0;
  uStack_210 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_288.sa_family = 0;
  local_288.sa_data[0] = '\0';
  local_288.sa_data[1] = '\0';
  local_288.sa_data[2] = '\0';
  local_288.sa_data[3] = '\0';
  local_288.sa_data[4] = '\0';
  local_288.sa_data[5] = '\0';
  local_288.sa_data[6] = '\0';
  local_288.sa_data[7] = '\0';
  local_288.sa_data[8] = '\0';
  local_288.sa_data[9] = '\0';
  local_288.sa_data[10] = '\0';
  local_288.sa_data[0xb] = '\0';
  local_288.sa_data[0xc] = '\0';
  local_288.sa_data[0xd] = '\0';
  local_2b4 = uVar13;
  local_2a8 = pCVar2;
  if ((__s == (byte *)0x0) || (sVar9 = strlen((char *)__s), 0xfe < sVar9)) {
    if ((int)local_2c0 == 2) {
LAB_001279f7:
      local_288.sa_data._0_2_ = uVar15 << 8 | uVar15 >> 8;
      local_288.sa_family = 2;
      __len = 0x10;
    }
    else {
      __len = 0;
      if ((int)local_2c0 == 10) {
        local_288.sa_data._0_2_ = uVar15 << 8 | uVar15 >> 8;
        local_288.sa_family = 10;
        __len = 0x1c;
      }
    }
LAB_00127a19:
    while (iVar8 = bind(local_2b4,&local_288,__len), iVar8 < 0) {
      if (iVar6 < 2) {
        puVar12 = (uint *)__errno_location();
        pCVar1 = local_2a8;
        uVar13 = *puVar12;
        (local_2a8->state).os_errno = uVar13;
        pcVar14 = Curl_strerror(conn,uVar13);
        Curl_failf(pCVar1,"bind failed with errno %d: %s",(ulong)uVar13,pcVar14);
        Curl_closesocket(conn,local_2c4);
        return CURLE_INTERFACE_FAILED;
      }
      iVar6 = iVar6 + -1;
      Curl_infof(local_2a8,"Bind to local port %hu failed, trying next\n",(ulong)uVar15);
      uVar15 = uVar15 + 1;
      local_288.sa_data._0_2_ = uVar15 * 0x100 | uVar15 >> 8;
    }
    local_28c = 0x80;
    local_138.sa_family = 0;
    local_138.sa_data[0] = '\0';
    local_138.sa_data[1] = '\0';
    local_138.sa_data[2] = '\0';
    local_138.sa_data[3] = '\0';
    local_138.sa_data[4] = '\0';
    local_138.sa_data[5] = '\0';
    local_138.sa_data[6] = '\0';
    local_138.sa_data[7] = '\0';
    local_138.sa_data[8] = '\0';
    local_138.sa_data[9] = '\0';
    local_138.sa_data[10] = '\0';
    local_138.sa_data[0xb] = '\0';
    local_138.sa_data[0xc] = '\0';
    local_138.sa_data[0xd] = '\0';
    local_128 = 0;
    uStack_120 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    iVar6 = getsockname(local_2b4,&local_138,&local_28c);
    if (iVar6 < 0) {
      puVar12 = (uint *)__errno_location();
      pCVar2 = local_2a8;
      uVar13 = *puVar12;
      (local_2a8->state).os_errno = uVar13;
      pcVar14 = Curl_strerror(conn,uVar13);
      Curl_failf(pCVar2,"getsockname() failed with errno %d: %s",(ulong)uVar13,pcVar14);
      goto LAB_00127afa;
    }
    iVar17 = IF2IP_NOT_FOUND;
    Curl_infof(local_2a8,"Local port: %hu\n",(ulong)uVar15);
    (conn->bits).bound = true;
  }
  else {
    memset(&local_138,0,0x100);
    local_294 = *__s - 0x69;
    if ((local_294 == 0) && (local_294 = __s[1] - 0x66, local_294 == 0)) {
      local_294 = 0x21 - (uint)__s[2];
    }
    else {
      local_294 = -local_294;
    }
    if (local_294 != 0) {
      iVar8 = strncmp("host!",(char *)__s,5);
      if (iVar8 != 0) goto LAB_001277f6;
      local_2b0 = __s + 5;
      goto LAB_001278ba;
    }
    __s = __s + 3;
LAB_001277f6:
    sVar9 = strlen((char *)__s);
    iVar8 = setsockopt(local_2b4,1,0x19,__s,(int)sVar9 + 1);
    if (iVar8 == 0) {
      iVar17 = IF2IP_NOT_FOUND;
      goto LAB_00127b00;
    }
    uVar13 = (uint)local_2b0;
    local_2b0 = __s;
    iVar17 = Curl_if2ip((int)local_2c0,uVar13,conn->scope_id,(char *)__s,(char *)&local_138,0x100);
    if (iVar17 == IF2IP_FOUND) {
      Curl_infof(local_2a8,"Local Interface %s is ip %s using address family %i\n",local_2b0,
                 &local_138,(ulong)local_2c0 & 0xffffffff);
LAB_00127975:
      __len = 0;
      if ((int)local_2c0 == 2) {
        iVar8 = inet_pton(2,(char *)&local_138,local_288.sa_data + 2);
        if (0 < iVar8) goto LAB_001279f7;
      }
      else {
        __len = 0;
        if ((int)local_2c0 == 10) {
          pcVar14 = strchr((char *)&local_138,0x25);
          if (pcVar14 == (char *)0x0) {
            local_2c0 = (char *)0x0;
          }
          else {
            local_2c0 = pcVar14 + 1;
            *pcVar14 = '\0';
          }
          iVar8 = inet_pton(10,(char *)&local_138,local_288.sa_data + 6);
          __len = 0x1c;
          if (0 < iVar8) {
            local_288.sa_data._0_2_ = uVar15 << 8 | uVar15 >> 8;
            local_288.sa_family = 10;
            if (local_2c0 != (char *)0x0) {
              iVar8 = atoi(local_2c0);
              uStack_270 = CONCAT44(uStack_270._4_4_,iVar8);
            }
          }
        }
      }
      goto LAB_00127a19;
    }
    if (iVar17 == IF2IP_AF_NOT_SUPPORTED) goto LAB_00127b00;
    if (iVar17 == IF2IP_NOT_FOUND) {
      if (local_294 != 0) {
LAB_001278ba:
        lVar3 = conn->ip_version;
        if ((int)local_2c0 == 2) {
          lVar10 = 1;
LAB_001278db:
          conn->ip_version = lVar10;
        }
        else if ((int)local_2c0 == 10) {
          lVar10 = 2;
          goto LAB_001278db;
        }
        iVar8 = Curl_resolv(conn,(char *)local_2b0,0,&local_2a0);
        if (iVar8 == 1) {
          Curl_resolver_wait_resolv(conn,&local_2a0);
        }
        conn->ip_version = lVar3;
        if (local_2a0 != (Curl_dns_entry *)0x0) {
          Curl_printable_address(local_2a0->addr,(char *)&local_138,0x100);
          pCVar2 = local_2a8;
          Curl_infof(local_2a8,"Name \'%s\' family %i resolved to \'%s\' family %i\n",local_2b0,
                     (ulong)local_2c0 & 0xffffffff,&local_138,
                     (ulong)(uint)local_2a0->addr->ai_family);
          Curl_resolv_unlock(pCVar2,local_2a0);
          goto LAB_00127975;
        }
        goto LAB_001279c2;
      }
      pcVar14 = "Couldn\'t bind to interface \'%s\'";
    }
    else {
      if (local_294 != 0) goto LAB_001278ba;
LAB_001279c2:
      (local_2a8->state).errorbuf = false;
      pcVar14 = "Couldn\'t bind to \'%s\'";
    }
    Curl_failf(local_2a8,pcVar14,local_2b0);
LAB_00127afa:
    iVar17 = 0x2d;
  }
LAB_00127b00:
  uVar13 = local_2c4;
  uVar16 = local_2b8;
  if (iVar17 != IF2IP_NOT_FOUND) {
    Curl_closesocket(conn,local_2c4);
    if (iVar17 == IF2IP_AF_NOT_SUPPORTED) {
      return CURLE_COULDNT_CONNECT;
    }
    return iVar17;
  }
LAB_00127b32:
  curlx_nonblock(uVar13,1);
  cVar18 = Curl_now();
  (conn->connecttime).tv_sec = cVar18.tv_sec;
  (conn->connecttime).tv_usec = cVar18.tv_usec;
  if (1 < conn->num_addr) {
    Curl_expire(pCVar1,conn->timeoutms_per_addr,EXPIRE_DNS_PER_NAME);
  }
  if (((char)uVar16 == '\0') && (conn->socktype == 1)) {
    if ((conn->bits).tcp_fastopen == true) {
      iVar6 = setsockopt(uVar13,6,0x1e,&local_290,4);
      if (iVar6 < 0) {
        Curl_infof(pCVar1,"Failed to enable TCP Fast Open on fd %d\n",(ulong)uVar13);
      }
      else {
        Curl_infof(pCVar1,"TCP_FASTOPEN_CONNECT set\n");
      }
    }
    iVar6 = connect(uVar13,(sockaddr *)(local_1c8 + 0x10),local_1c8._12_4_);
    if (iVar6 == -1) {
      piVar11 = __errno_location();
      iVar6 = *piVar11;
      if ((iVar6 != 0xb) && (iVar6 != 0x73)) {
        pcVar14 = Curl_strerror(conn,iVar6);
        Curl_infof(pCVar1,"Immediate connect fail for %s: %s\n",local_1f8,pcVar14);
        (pCVar1->state).os_errno = iVar6;
        Curl_closesocket(conn,uVar13);
        return CURLE_COULDNT_CONNECT;
      }
    }
  }
  *sockp = uVar13;
  return CURLE_OK;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!Curl_getaddressinfo((struct sockaddr*)&addr.sa_addr,
                          ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(conn, errno));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    Curl_tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_now();
  if(conn->num_addr > 1)
    Curl_expire(data, conn->timeoutms_per_addr, EXPIRE_DNS_PER_NAME);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
      /* while connectx function is available since macOS 10.11 / iOS 9,
         it did not have the interface declared correctly until
         Xcode 9 / macOS SDK 10.13 */
      if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
        sa_endpoints_t endpoints;
        endpoints.sae_srcif = 0;
        endpoints.sae_srcaddr = NULL;
        endpoints.sae_srcaddrlen = 0;
        endpoints.sae_dstaddr = &addr.sa_addr;
        endpoints.sae_dstaddrlen = addr.addrlen;

        rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                      CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                      NULL, 0, NULL, NULL);
      }
      else {
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      }
#  else
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
      if(setsockopt(sockfd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                    (void *)&optval, sizeof(optval)) < 0)
        infof(data, "Failed to enable TCP Fast Open on fd %d\n", sockfd);
      else
        infof(data, "TCP_FASTOPEN_CONNECT set\n");

      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn, error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}